

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.h
# Opt level: O0

void __thiscall inject::circular_dependency::~circular_dependency(circular_dependency *this)

{
  circular_dependency *this_local;
  
  *(undefined ***)this = &PTR__circular_dependency_00133870;
  std::__cxx11::string::~string((string *)&this->_msg);
  std::exception::~exception(&this->super_exception);
  return;
}

Assistant:

virtual ~circular_dependency() throw() { }